

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

void avePooling(pBox *pbox,pBox *Matrix,int kernelSize,int stride)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  mydataFmt *pmVar6;
  int iVar7;
  ulong uVar8;
  mydataFmt *pmVar9;
  mydataFmt *pmVar10;
  mydataFmt *pmVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int i;
  ulong uVar16;
  float fVar17;
  
  pmVar6 = pbox->pdata;
  if (pmVar6 == (mydataFmt *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"the feature2Matrix pbox is NULL!!",0x21);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    return;
  }
  iVar1 = pbox->width;
  if (((iVar1 - kernelSize) % stride == 0) &&
     (iVar2 = pbox->height, (iVar2 - kernelSize) % stride == 0)) {
    iVar3 = Matrix->height;
    if (0 < (long)iVar3) {
      pmVar9 = Matrix->pdata;
      uVar4 = Matrix->width;
      iVar7 = 0;
      lVar12 = 0;
      do {
        if (0 < (int)uVar4) {
          pmVar10 = pmVar6 + iVar7;
          uVar5 = pbox->channel;
          uVar13 = 0;
          do {
            if (0 < (int)uVar5) {
              iVar14 = 0;
              uVar8 = 0;
              do {
                if (kernelSize < 1) {
                  fVar17 = 0.0;
                }
                else {
                  pmVar11 = pmVar10 + iVar14;
                  fVar17 = 0.0;
                  uVar15 = 0;
                  do {
                    uVar16 = 0;
                    do {
                      fVar17 = fVar17 + pmVar11[uVar16];
                      uVar16 = uVar16 + 1;
                    } while ((uint)kernelSize != uVar16);
                    uVar15 = uVar15 + 1;
                    pmVar11 = pmVar11 + iVar1;
                  } while (uVar15 != (uint)kernelSize);
                }
                pmVar9[(int)(uVar4 * iVar3 * (int)uVar8)] =
                     fVar17 / (float)(kernelSize * kernelSize);
                uVar8 = uVar8 + 1;
                iVar14 = iVar14 + iVar2 * iVar1;
              } while (uVar8 != uVar5);
            }
            pmVar9 = pmVar9 + 1;
            uVar13 = uVar13 + 1;
            pmVar10 = pmVar10 + stride;
          } while (uVar13 != uVar4);
        }
        lVar12 = lVar12 + 1;
        iVar7 = iVar7 + stride * iVar1;
      } while (lVar12 != iVar3);
    }
  }
  return;
}

Assistant:

void avePooling(const pBox *pbox, pBox *Matrix, int kernelSize, int stride) {
    if (pbox->pdata == NULL) {
        cout << "the feature2Matrix pbox is NULL!!" << endl;
        return;
    }
    mydataFmt *p = Matrix->pdata;
    mydataFmt *pIn;
    mydataFmt *ptemp;
    mydataFmt sumNum = 0;
    if ((pbox->width - kernelSize) % stride == 0 && (pbox->height - kernelSize) % stride == 0) {
        for (int row = 0; row < Matrix->height; row++) {
            for (int col = 0; col < Matrix->width; col++) {
                pIn = pbox->pdata + row * stride * pbox->width + col * stride;

                for (int channel = 0; channel < pbox->channel; channel++) {

                    ptemp = pIn + channel * pbox->height * pbox->width;
                    sumNum = 0;
                    for (int kernelRow = 0; kernelRow < kernelSize; kernelRow++) {
                        for (int i = 0; i < kernelSize; i++) {
                            sumNum += *(ptemp + i + kernelRow * pbox->width);
                        }
                    }
                    *(p + channel * Matrix->height * Matrix->width) = sumNum / (kernelSize * kernelSize);
                }
                p++;
            }
        }
    }
}